

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgky(fitsfile *fptr,int datatype,char *keyname,void *value,char *comm,int *status)

{
  int iVar1;
  long *in_RCX;
  int in_ESI;
  char *in_RDI;
  int *in_R9;
  char *unaff_retaddr;
  double doubleval;
  ULONGLONG ulongval;
  LONGLONG longval;
  int *in_stack_00000058;
  char *in_stack_00000060;
  double *in_stack_00000068;
  char *in_stack_00000070;
  fitsfile *in_stack_00000078;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_R9 < 1) {
    if (in_ESI == 0x10) {
      ffgkys((fitsfile *)doubleval,unaff_retaddr,
             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (int *)CONCAT44(0x10,in_stack_ffffffffffffffe8));
    }
    else if (in_ESI == 0xb) {
      iVar1 = ffgkyjj((fitsfile *)doubleval,unaff_retaddr,
                      (LONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,(int *)CONCAT44(0xb,in_stack_ffffffffffffffe8));
      if (iVar1 < 1) {
        if ((local_40 < 0x100) && (-1 < local_40)) {
          *(char *)in_RCX = (char)local_40;
        }
        else {
          *in_R9 = 0x19c;
        }
      }
    }
    else if (in_ESI == 0xc) {
      iVar1 = ffgkyjj((fitsfile *)doubleval,unaff_retaddr,
                      (LONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,(int *)CONCAT44(0xc,in_stack_ffffffffffffffe8));
      if (iVar1 < 1) {
        if ((local_40 < 0x80) && (-0x81 < local_40)) {
          *(char *)in_RCX = (char)local_40;
        }
        else {
          *in_R9 = 0x19c;
        }
      }
    }
    else if (in_ESI == 0x14) {
      iVar1 = ffgkyjj((fitsfile *)doubleval,unaff_retaddr,
                      (LONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,(int *)CONCAT44(0x14,in_stack_ffffffffffffffe8));
      if (iVar1 < 1) {
        if ((local_40 < 0x10000) && (-1 < local_40)) {
          *(short *)in_RCX = (short)local_40;
        }
        else {
          *in_R9 = 0x19c;
        }
      }
    }
    else if (in_ESI == 0x15) {
      iVar1 = ffgkyjj((fitsfile *)doubleval,unaff_retaddr,
                      (LONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,(int *)CONCAT44(0x15,in_stack_ffffffffffffffe8));
      if (iVar1 < 1) {
        if ((local_40 < 0x8000) && (-0x8001 < local_40)) {
          *(short *)in_RCX = (short)local_40;
        }
        else {
          *in_R9 = 0x19c;
        }
      }
    }
    else if (in_ESI == 0x1e) {
      iVar1 = ffgkyjj((fitsfile *)doubleval,unaff_retaddr,
                      (LONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,(int *)CONCAT44(0x1e,in_stack_ffffffffffffffe8));
      if (iVar1 < 1) {
        if ((local_40 < 0x100000000) && (-1 < local_40)) {
          *(int *)in_RCX = (int)local_40;
        }
        else {
          *in_R9 = 0x19c;
        }
      }
    }
    else if (in_ESI == 0x1f) {
      iVar1 = ffgkyjj((fitsfile *)doubleval,unaff_retaddr,
                      (LONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,(int *)CONCAT44(0x1f,in_stack_ffffffffffffffe8));
      if (iVar1 < 1) {
        if ((local_40 < 0x80000000) && (-0x80000001 < local_40)) {
          *(int *)in_RCX = (int)local_40;
        }
        else {
          *in_R9 = 0x19c;
        }
      }
    }
    else if (in_ESI == 0xe) {
      ffgkyl((fitsfile *)doubleval,unaff_retaddr,
             (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (int *)CONCAT44(0xe,in_stack_ffffffffffffffe8));
    }
    else if (in_ESI == 0x28) {
      iVar1 = ffgkyujj((fitsfile *)doubleval,unaff_retaddr,
                       (ULONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(int *)CONCAT44(0x28,in_stack_ffffffffffffffe8));
      if (iVar1 < 1) {
        *in_RCX = local_48;
      }
    }
    else if (in_ESI == 0x29) {
      iVar1 = ffgkyjj((fitsfile *)doubleval,unaff_retaddr,
                      (LONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,(int *)CONCAT44(0x29,in_stack_ffffffffffffffe8));
      if (iVar1 < 1) {
        if (local_40 < -0x8000000000000000) {
          *in_R9 = 0x19c;
        }
        else {
          *in_RCX = local_40;
        }
      }
    }
    else if (in_ESI == 0x50) {
      ffgkyujj((fitsfile *)doubleval,unaff_retaddr,
               (ULONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               (int *)CONCAT44(0x50,in_stack_ffffffffffffffe8));
    }
    else if (in_ESI == 0x51) {
      ffgkyjj((fitsfile *)doubleval,unaff_retaddr,
              (LONGLONG *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
              (int *)CONCAT44(0x51,in_stack_ffffffffffffffe8));
    }
    else if (in_ESI == 0x2a) {
      ffgkye((fitsfile *)doubleval,unaff_retaddr,
             (float *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (int *)CONCAT44(0x2a,in_stack_ffffffffffffffe8));
    }
    else if (in_ESI == 0x52) {
      ffgkyd((fitsfile *)doubleval,unaff_retaddr,
             (double *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (int *)CONCAT44(0x52,in_stack_ffffffffffffffe8));
    }
    else if (in_ESI == 0x53) {
      ffgkyc(in_stack_00000078,in_stack_00000070,(float *)in_stack_00000068,in_stack_00000060,
             in_stack_00000058);
    }
    else if (in_ESI == 0xa3) {
      ffgkym(in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
             in_stack_00000058);
    }
    else {
      *in_R9 = 0x19a;
    }
    iVar1 = *in_R9;
  }
  else {
    iVar1 = *in_R9;
  }
  return iVar1;
}

Assistant:

int ffgky( fitsfile *fptr,     /* I - FITS file pointer        */
           int  datatype,      /* I - datatype of the value    */
           const char *keyname,      /* I - name of keyword to read  */
           void *value,        /* O - keyword value            */
           char *comm,         /* O - keyword comment          */
           int  *status)       /* IO - error status            */
/*
  Read (get) the keyword value and comment from the FITS header.
  Reads a keyword value with the datatype specified by the 2nd argument.
*/
{
    LONGLONG longval;
    ULONGLONG ulongval;
    double doubleval;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TSTRING)
    {
        ffgkys(fptr, keyname, (char *) value, comm, status);
    }
    else if (datatype == TBYTE)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > UCHAR_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned char *) value = (unsigned char) longval;
        }
    }
    else if (datatype == TSBYTE)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > 127 || longval < -128)
                *status = NUM_OVERFLOW;
            else
                *(signed char *) value = (signed char) longval;
        }
    }
    else if (datatype == TUSHORT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > (unsigned short) USHRT_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned short *) value = (unsigned short) longval;
        }
    }
    else if (datatype == TSHORT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > SHRT_MAX || longval < SHRT_MIN)
                *status = NUM_OVERFLOW;
            else
                *(short *) value = (short) longval;
        }
    }
    else if (datatype == TUINT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > (unsigned int) UINT_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned int *) value = longval;
        }
    }
    else if (datatype == TINT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > INT_MAX || longval < INT_MIN)
                *status = NUM_OVERFLOW;
            else
                *(int *) value = longval;
        }
    }
    else if (datatype == TLOGICAL)
    {
        ffgkyl(fptr, keyname, (int *) value, comm, status);
    }
    else if (datatype == TULONG)
    {
        if (ffgkyujj(fptr, keyname, &ulongval, comm, status) <= 0)
        {
            if (ulongval > ULONG_MAX)
                *status = NUM_OVERFLOW;
            else
                 *(unsigned long *) value = ulongval;
        }
    }
    else if (datatype == TLONG)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > LONG_MAX || longval < LONG_MIN)
                *status = NUM_OVERFLOW;
            else
                *(long *) value = longval;
        }
    }
    else if (datatype == TULONGLONG)
    {
        ffgkyujj(fptr, keyname, (ULONGLONG *) value, comm, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgkyjj(fptr, keyname, (LONGLONG *) value, comm, status);
    }
    else if (datatype == TFLOAT)
    {
        ffgkye(fptr, keyname, (float *) value, comm, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgkyd(fptr, keyname, (double *) value, comm, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffgkyc(fptr, keyname, (float *) value, comm, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffgkym(fptr, keyname, (double *) value, comm, status);
    }
    else
        *status = BAD_DATATYPE;

    return(*status);
}